

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

void __thiscall QCborStreamReaderPrivate::initDecoder(QCborStreamReaderPrivate *this)

{
  Code CVar1;
  
  QList<CborValue>::clear(&(this->containerStack).super_QList<CborValue>);
  this->bufferStart = 0;
  if (this->device != (QIODevice *)0x0) {
    QByteArray::clear(&this->buffer);
    QByteArray::reserve(&this->buffer,0x100);
  }
  preread(this);
  (this->parser).source.end = (uint8_t *)0x0;
  *(undefined8 *)&(this->parser).flags = 0;
  (this->parser).source.end = (uint8_t *)0x0;
  (this->parser).flags = CborParserFlag_ExternalSource;
  (this->currentElement).parser = &this->parser;
  (this->currentElement).source.ptr = (uint8_t *)this;
  (this->currentElement).remaining = 1;
  CVar1 = preparse_value(&this->currentElement);
  if ((CVar1 != NoError) && (CVar1 != EndOfFile)) {
    this->corrupt = true;
  }
  (this->lastError).c = CVar1;
  return;
}

Assistant:

void initDecoder()
    {
        containerStack.clear();
        bufferStart = 0;
        if (device) {
            buffer.clear();
            buffer.reserve(IdealIoBufferSize);      // sets the CapacityReserved flag
        }

        preread();
        if (CborError err = cbor_parser_init_reader(nullptr, &parser, &currentElement, this))
            handleError(err);
        else
            lastError = { QCborError::NoError };
    }